

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall S2BooleanOperation::Options::Options(Options *this,Options *options)

{
  pointer pSVar1;
  Options *options_local;
  Options *this_local;
  
  pSVar1 = std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::
           operator->(&options->snap_function_);
  (*pSVar1->_vptr_SnapFunction[6])(this);
  this->polygon_model_ = options->polygon_model_;
  this->polyline_model_ = options->polyline_model_;
  this->polyline_loops_have_boundaries_ = (bool)(options->polyline_loops_have_boundaries_ & 1);
  this->precision_ = options->precision_;
  this->conservative_output_ = (bool)(options->conservative_output_ & 1);
  this->source_id_lexicon_ = options->source_id_lexicon_;
  return;
}

Assistant:

S2BooleanOperation::Options::Options(const Options& options)
    :  snap_function_(options.snap_function_->Clone()),
       polygon_model_(options.polygon_model_),
       polyline_model_(options.polyline_model_),
       polyline_loops_have_boundaries_(options.polyline_loops_have_boundaries_),
       precision_(options.precision_),
       conservative_output_(options.conservative_output_),
       source_id_lexicon_(options.source_id_lexicon_) {
}